

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcacheRemoveFromDirtyList(PgHdr *pPage)

{
  PCache *pPVar1;
  bool bVar2;
  PgHdr *local_20;
  PgHdr *pSynced;
  PCache *p;
  PgHdr *pPage_local;
  
  pPVar1 = pPage->pCache;
  if (pPVar1->pSynced == pPage) {
    local_20 = pPage->pDirtyPrev;
    while( true ) {
      bVar2 = false;
      if (local_20 != (PgHdr *)0x0) {
        bVar2 = (local_20->flags & 4) != 0;
      }
      if (!bVar2) break;
      local_20 = local_20->pDirtyPrev;
    }
    pPVar1->pSynced = local_20;
  }
  if (pPage->pDirtyNext == (PgHdr *)0x0) {
    pPVar1->pDirtyTail = pPage->pDirtyPrev;
  }
  else {
    pPage->pDirtyNext->pDirtyPrev = pPage->pDirtyPrev;
  }
  if (pPage->pDirtyPrev == (PgHdr *)0x0) {
    pPVar1->pDirty = pPage->pDirtyNext;
  }
  else {
    pPage->pDirtyPrev->pDirtyNext = pPage->pDirtyNext;
  }
  pPage->pDirtyNext = (PgHdr *)0x0;
  pPage->pDirtyPrev = (PgHdr *)0x0;
  return;
}

Assistant:

static void pcacheRemoveFromDirtyList(PgHdr *pPage){
  PCache *p = pPage->pCache;

  assert( pPage->pDirtyNext || pPage==p->pDirtyTail );
  assert( pPage->pDirtyPrev || pPage==p->pDirty );

  /* Update the PCache1.pSynced variable if necessary. */
  if( p->pSynced==pPage ){
    PgHdr *pSynced = pPage->pDirtyPrev;
    while( pSynced && (pSynced->flags&PGHDR_NEED_SYNC) ){
      pSynced = pSynced->pDirtyPrev;
    }
    p->pSynced = pSynced;
  }

  if( pPage->pDirtyNext ){
    pPage->pDirtyNext->pDirtyPrev = pPage->pDirtyPrev;
  }else{
    assert( pPage==p->pDirtyTail );
    p->pDirtyTail = pPage->pDirtyPrev;
  }
  if( pPage->pDirtyPrev ){
    pPage->pDirtyPrev->pDirtyNext = pPage->pDirtyNext;
  }else{
    assert( pPage==p->pDirty );
    p->pDirty = pPage->pDirtyNext;
  }
  pPage->pDirtyNext = 0;
  pPage->pDirtyPrev = 0;

  expensive_assert( pcacheCheckSynced(p) );
}